

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

HatchFillType ON_HatchPattern::HatchFillTypeFromUnsigned(uint hatch_fill_type_as_unsigned)

{
  HatchFillType local_c;
  uint hatch_fill_type_as_unsigned_local;
  
  if (hatch_fill_type_as_unsigned == 0) {
    local_c = Solid;
  }
  else if (hatch_fill_type_as_unsigned == 1) {
    local_c = Lines;
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_hatch.cpp"
               ,0x260,"","Invalid hatch_fill_type_as_unsigned value.");
    local_c = Solid;
  }
  return local_c;
}

Assistant:

ON_HatchPattern::HatchFillType ON_HatchPattern::HatchFillTypeFromUnsigned(
  unsigned hatch_fill_type_as_unsigned
  )
{
  switch (hatch_fill_type_as_unsigned)
  {
    ON_ENUM_FROM_UNSIGNED_CASE(ON_HatchPattern::HatchFillType::Solid);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_HatchPattern::HatchFillType::Lines);
    //ON_ENUM_FROM_UNSIGNED_CASE(ON_HatchPattern::HatchFillType::Gradient);
  }
  ON_ERROR("Invalid hatch_fill_type_as_unsigned value.");
  return ON_HatchPattern::HatchFillType::Solid;
}